

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O2

int Ssc_GiaClassesRefine(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vRefined;
  Gia_Obj_t *pObj;
  int iVar3;
  uint i;
  long lVar4;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscClass.c"
                  ,0x11c,"int Ssc_GiaClassesRefine(Gia_Man_t *)");
  }
  vRefined = Vec_IntAlloc((int)p);
  iVar3 = 0;
  for (lVar4 = 0; lVar4 < p->nObjs; lVar4 = lVar4 + 1) {
    iVar2 = (int)lVar4;
    pObj = Gia_ManObj(p,iVar2);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjIsCand(pObj);
    if (iVar1 != 0) {
      i = (uint)p->pReprs[lVar4] & 0xfffffff;
      if (i == 0) {
LAB_004a8eca:
        iVar1 = Ssc_GiaSimIsConst0(p,iVar2);
        if (iVar1 == 0) {
          Vec_IntPush(vRefined,iVar2);
        }
      }
      else if (i != 0xfffffff) {
        if (p->pNexts[lVar4] == 0) {
          iVar2 = Ssc_GiaSimClassRefineOne(p,i);
          iVar3 = iVar3 + iVar2;
        }
        else if (i == 0) goto LAB_004a8eca;
      }
    }
  }
  Ssc_GiaSimProcessRefined(p,vRefined);
  iVar2 = vRefined->nSize;
  free(vRefined->pArray);
  free(vRefined);
  return iVar3 + iVar2;
}

Assistant:

int Ssc_GiaClassesRefine( Gia_Man_t * p )
{
    Vec_Int_t * vRefinedC;
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    assert( p->pReprs != NULL );
    vRefinedC = Vec_IntAlloc( 100 );
    Gia_ManForEachCand( p, pObj, i )
        if ( Gia_ObjIsTail(p, i) )
            Counter += Ssc_GiaSimClassRefineOne( p, Gia_ObjRepr(p, i) );
        else if ( Gia_ObjIsConst(p, i) && !Ssc_GiaSimIsConst0(p, i) )
            Vec_IntPush( vRefinedC, i );
    Ssc_GiaSimProcessRefined( p, vRefinedC );
    Counter += Vec_IntSize( vRefinedC );
    Vec_IntFree( vRefinedC );
    return Counter;
}